

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O2

int search_filter_level(YV12_BUFFER_CONFIG *sd,AV1_COMP *cpi,int partial_frame,
                       int *last_frame_filter_level,int plane,int dir,int64_t *best_filter_sse)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint filt_level;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint local_26c;
  int64_t ss_err [64];
  
  if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) {
    local_26c = 0x3f;
  }
  else {
    local_26c = (uint)((cpi->ppi->twopass).section_intra_rating < 9) << 4 | 0x2f;
  }
  if (plane == 2) {
    uVar2 = last_frame_filter_level[3];
  }
  else if (plane == 1) {
    uVar2 = last_frame_filter_level[2];
  }
  else if (dir == 2) {
    uVar2 = *last_frame_filter_level + last_frame_filter_level[1] + 1 >> 1;
  }
  else {
    uVar2 = last_frame_filter_level[(uint)dir];
  }
  uVar12 = local_26c;
  if ((int)uVar2 < (int)local_26c) {
    uVar12 = uVar2;
  }
  if ((int)uVar2 < 0) {
    uVar12 = 0;
  }
  uVar11 = (ulong)uVar12;
  uVar4 = 4;
  if (0xf < uVar12) {
    uVar4 = (ulong)(uVar12 >> 2);
  }
  iVar1 = secconv_lvl3[(cpi->sf).lpf_sf.use_coarse_filter_level_search];
  memset(ss_err,0xff,0x200);
  yv12_copy_plane(&((cpi->common).cur_frame)->buf,&cpi->last_frame_uf,plane);
  lVar3 = try_filter_frame(sd,cpi,uVar12,partial_frame,plane,dir);
  iVar8 = 0;
  ss_err[uVar11] = lVar3;
  while( true ) {
    uVar12 = (uint)uVar4;
    uVar2 = (uint)uVar11;
    if ((int)uVar12 <= iVar1) break;
    filt_level = uVar12 + uVar2;
    if ((int)local_26c <= (int)(uVar12 + uVar2)) {
      filt_level = local_26c;
    }
    uVar9 = uVar2 - uVar12;
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    lVar6 = uVar4 * (lVar3 >> ((char)((int)uVar2 / -8) + 0xfU & 0x3f));
    if ((AOM_RC_FIRST_PASS < (cpi->oxcf).pass) &&
       (uVar4 = (ulong)(cpi->ppi->twopass).section_intra_rating, uVar4 < 0x14)) {
      lVar6 = (long)(lVar6 * uVar4) / 0x14;
    }
    lVar6 = lVar6 >> ((cpi->common).features.tx_mode != '\0');
    lVar7 = lVar3;
    uVar10 = uVar2;
    if ((iVar8 < 1) && (uVar9 != uVar2)) {
      lVar5 = ss_err[uVar9];
      if (lVar5 < 0) {
        lVar5 = try_filter_frame(sd,cpi,uVar9,partial_frame,plane,dir);
        ss_err[uVar9] = lVar5;
      }
      if ((lVar5 < lVar3 + lVar6) && (lVar7 = lVar5, uVar10 = uVar9, lVar3 <= lVar5)) {
        lVar7 = lVar3;
      }
    }
    lVar3 = lVar7;
    uVar9 = uVar10;
    if ((-1 < iVar8) && (filt_level != uVar2)) {
      lVar3 = ss_err[(int)filt_level];
      if (lVar3 < 0) {
        lVar3 = try_filter_frame(sd,cpi,filt_level,partial_frame,plane,dir);
        ss_err[(int)filt_level] = lVar3;
      }
      uVar9 = filt_level;
      if (lVar7 - lVar6 <= lVar3) {
        lVar3 = lVar7;
        uVar9 = uVar10;
      }
    }
    iVar8 = 0;
    if (uVar9 != uVar2) {
      iVar8 = (uint)((int)uVar2 <= (int)uVar9) * 2 + -1;
    }
    uVar4 = (ulong)(uVar12 >> (uVar9 == uVar2));
    uVar11 = (ulong)uVar9;
  }
  *best_filter_sse = ss_err[(int)uVar2];
  return uVar2;
}

Assistant:

static int search_filter_level(const YV12_BUFFER_CONFIG *sd, AV1_COMP *cpi,
                               int partial_frame,
                               const int *last_frame_filter_level, int plane,
                               int dir, int64_t *best_filter_sse) {
  const AV1_COMMON *const cm = &cpi->common;
  const int min_filter_level = 0;
  const int max_filter_level = get_max_filter_level(cpi);
  int filt_direction = 0;
  int64_t best_err;
  int filt_best;

  // Start the search at the previous frame filter level unless it is now out of
  // range.
  int lvl;
  switch (plane) {
    case 0:
      switch (dir) {
        case 2:
          lvl = (last_frame_filter_level[0] + last_frame_filter_level[1] + 1) >>
                1;
          break;
        case 0:
        case 1: lvl = last_frame_filter_level[dir]; break;
        default: assert(dir >= 0 && dir <= 2); return 0;
      }
      break;
    case 1: lvl = last_frame_filter_level[2]; break;
    case 2: lvl = last_frame_filter_level[3]; break;
    default: assert(plane >= 0 && plane <= 2); return 0;
  }
  int filt_mid = clamp(lvl, min_filter_level, max_filter_level);
  int filter_step = filt_mid < 16 ? 4 : filt_mid / 4;
  // Sum squared error at each filter level
  int64_t ss_err[MAX_LOOP_FILTER + 1];

  const int use_coarse_search = cpi->sf.lpf_sf.use_coarse_filter_level_search;
  assert(use_coarse_search <= 1);
  static const int min_filter_step_lookup[2] = { 0, 2 };
  // min_filter_step_thesh determines the stopping criteria for the search.
  // The search is terminated when filter_step equals min_filter_step_thesh.
  const int min_filter_step_thesh = min_filter_step_lookup[use_coarse_search];

  // Set each entry to -1
  memset(ss_err, 0xFF, sizeof(ss_err));
  yv12_copy_plane(&cm->cur_frame->buf, &cpi->last_frame_uf, plane);
  best_err = try_filter_frame(sd, cpi, filt_mid, partial_frame, plane, dir);
  filt_best = filt_mid;
  ss_err[filt_mid] = best_err;

  while (filter_step > min_filter_step_thesh) {
    const int filt_high = AOMMIN(filt_mid + filter_step, max_filter_level);
    const int filt_low = AOMMAX(filt_mid - filter_step, min_filter_level);

    // Bias against raising loop filter in favor of lowering it.
    int64_t bias = (best_err >> (15 - (filt_mid / 8))) * filter_step;

    if ((is_stat_consumption_stage_twopass(cpi)) &&
        (cpi->ppi->twopass.section_intra_rating < 20))
      bias = (bias * cpi->ppi->twopass.section_intra_rating) / 20;

    // yx, bias less for large block size
    if (cm->features.tx_mode != ONLY_4X4) bias >>= 1;

    if (filt_direction <= 0 && filt_low != filt_mid) {
      // Get Low filter error score
      if (ss_err[filt_low] < 0) {
        ss_err[filt_low] =
            try_filter_frame(sd, cpi, filt_low, partial_frame, plane, dir);
      }
      // If value is close to the best so far then bias towards a lower loop
      // filter value.
      if (ss_err[filt_low] < (best_err + bias)) {
        // Was it actually better than the previous best?
        if (ss_err[filt_low] < best_err) {
          best_err = ss_err[filt_low];
        }
        filt_best = filt_low;
      }
    }

    // Now look at filt_high
    if (filt_direction >= 0 && filt_high != filt_mid) {
      if (ss_err[filt_high] < 0) {
        ss_err[filt_high] =
            try_filter_frame(sd, cpi, filt_high, partial_frame, plane, dir);
      }
      // If value is significantly better than previous best, bias added against
      // raising filter value
      if (ss_err[filt_high] < (best_err - bias)) {
        best_err = ss_err[filt_high];
        filt_best = filt_high;
      }
    }

    // Half the step distance if the best filter value was the same as last time
    if (filt_best == filt_mid) {
      filter_step /= 2;
      filt_direction = 0;
    } else {
      filt_direction = (filt_best < filt_mid) ? -1 : 1;
      filt_mid = filt_best;
    }
  }

  *best_filter_sse = ss_err[filt_best];

  return filt_best;
}